

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CivetServer.cpp
# Opt level: O0

string * __thiscall
CivetServer::getPostData_abi_cxx11_
          (string *__return_storage_ptr__,CivetServer *this,mg_connection *conn)

{
  int local_82c;
  undefined1 local_828 [4];
  int r;
  char buf [2048];
  mg_connection *conn_local;
  string *postdata;
  
  mg_lock_connection((mg_connection *)this);
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  local_82c = mg_read((mg_connection *)this,local_828,0x800);
  while (0 < local_82c) {
    std::__cxx11::string::append((char *)__return_storage_ptr__,(ulong)local_828);
    local_82c = mg_read((mg_connection *)this,local_828,0x800);
  }
  mg_unlock_connection((mg_connection *)this);
  return __return_storage_ptr__;
}

Assistant:

std::string
CivetServer::getPostData(struct mg_connection *conn)
{
	mg_lock_connection(conn);
	std::string postdata;
	char buf[2048];
	int r = mg_read(conn, buf, sizeof(buf));
	while (r > 0) {
		postdata.append(buf, r);
		r = mg_read(conn, buf, sizeof(buf));
	}
	mg_unlock_connection(conn);
	return postdata;
}